

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlCmpTextWriterNsStackEntry(void *data0,void *data1)

{
  int iVar1;
  undefined4 local_34;
  int rc;
  xmlTextWriterNsStackEntry *p1;
  xmlTextWriterNsStackEntry *p0;
  void *data1_local;
  void *data0_local;
  
  if (data0 == data1) {
    data0_local._4_4_ = 0;
  }
  else if (data0 == (void *)0x0) {
    data0_local._4_4_ = -1;
  }
  else if (data1 == (void *)0x0) {
    data0_local._4_4_ = 1;
  }
  else {
    iVar1 = xmlStrcmp(*data0,*data1);
    if ((iVar1 != 0) ||
       (local_34 = 0, *(long *)((long)data0 + 0x10) != *(long *)((long)data1 + 0x10))) {
      local_34 = -1;
    }
    data0_local._4_4_ = local_34;
  }
  return data0_local._4_4_;
}

Assistant:

static int
xmlCmpTextWriterNsStackEntry(const void *data0, const void *data1)
{
    xmlTextWriterNsStackEntry *p0;
    xmlTextWriterNsStackEntry *p1;
    int rc;

    if (data0 == data1)
        return 0;

    if (data0 == 0)
        return -1;

    if (data1 == 0)
        return 1;

    p0 = (xmlTextWriterNsStackEntry *) data0;
    p1 = (xmlTextWriterNsStackEntry *) data1;

    rc = xmlStrcmp(p0->prefix, p1->prefix);

    if ((rc != 0) || (p0->elem != p1->elem))
        rc = -1;

    return rc;
}